

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

void __thiscall sparse_square_matrix<bool>::recreate(sparse_square_matrix<bool> *this,uint32_t n)

{
  uint32_t n_local;
  sparse_square_matrix<bool> *this_local;
  
  this->N = n;
  std::vector<bool,_std::allocator<bool>_>::clear(&this->denseStorage);
  std::
  unordered_map<unsigned_long,_bool,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bool>_>_>
  ::clear(&this->sparseStorage);
  if (this->N < 0x2000) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&this->denseStorage,(ulong)(this->N * this->N),false);
  }
  return;
}

Assistant:

void recreate(uint32_t n) {
    N = n;
    denseStorage.clear();
    sparseStorage.clear();
    if (N < DenseLimit) {
      denseStorage.resize(N * N);
    }
  }